

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_bool32
drwav__read_fmt(drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,
               drwav_container container,drwav_uint64 *pRunningBytesReadOut,drwav_fmt *fmtOut)

{
  ulong uVar1;
  drwav_uint16 *pdVar2;
  ushort uVar3;
  long lVar4;
  drwav_fmt *pdVar5;
  drwav_result dVar6;
  drwav_bool32 dVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  drwav_uint8 fmt_cbSize [2];
  drwav_chunk_header header;
  drwav_uint8 fmt [16];
  drwav_uint8 fmtext [22];
  ushort local_8a;
  anon_union_16_2_e4b212a4_for_id local_88;
  int local_78;
  undefined4 uStack_74;
  uint local_70;
  drwav_uint16 local_68;
  drwav_uint16 local_66;
  drwav_uint32 local_64;
  drwav_uint32 local_60;
  drwav_uint16 local_5c;
  drwav_uint16 local_5a;
  drwav_fmt *local_50;
  drwav_uint16 local_48;
  drwav_uint32 local_46;
  undefined8 local_42;
  undefined8 uStack_3a;
  
  dVar6 = drwav__read_chunk_header
                    (onRead,pUserData,container,pRunningBytesReadOut,(drwav_chunk_header *)&local_88
                    );
  local_50 = fmtOut;
  if (dVar6 != 0) {
    return 0;
  }
  do {
    if (((container & ~drwav_container_rf64) != drwav_container_riff) ||
       (CONCAT13(local_88.fourcc[3],
                 CONCAT12(local_88.fourcc[2],CONCAT11(local_88.fourcc[1],local_88.fourcc[0]))) ==
        0x20746d66)) {
      if (container != drwav_container_w64) {
LAB_00122f5b:
        if ((container & ~drwav_container_rf64) != drwav_container_riff) {
          if (local_88.fourcc[0] != 'f') {
            return 0;
          }
          uVar8 = 0xffffffffffffffff;
          break;
        }
        if (local_88.fourcc[0] != 'f') {
          return 0;
        }
        if (local_88.fourcc[1] != 'm') {
          return 0;
        }
        if (local_88.fourcc[2] != 't') {
          return 0;
        }
        if (local_88.fourcc[3] != ' ') {
          return 0;
        }
        goto LAB_00122fcc;
      }
      if (local_88.fourcc[0] == 'f') {
        uVar8 = 0xffffffffffffffff;
        do {
          if (uVar8 == 0xe) goto LAB_00122f5b;
          lVar4 = uVar8 + 2;
          uVar1 = uVar8 + 1;
          lVar10 = uVar8 + 2;
          uVar8 = uVar1;
        } while (local_88.fourcc[lVar4] == drwavGUID_W64_FMT[lVar10]);
        if (0xe < uVar1) goto LAB_00122f5b;
      }
    }
    dVar7 = drwav__seek_forward(onSeek,(ulong)local_70 + CONCAT44(uStack_74,local_78),pUserData);
    if (dVar7 == 0) {
      return 0;
    }
    *pRunningBytesReadOut = *pRunningBytesReadOut + (ulong)local_70 + CONCAT44(uStack_74,local_78);
    dVar6 = drwav__read_chunk_header
                      (onRead,pUserData,container,pRunningBytesReadOut,
                       (drwav_chunk_header *)&local_88);
    if (dVar6 != 0) {
      return 0;
    }
  } while( true );
  while (lVar4 = uVar8 + 2, uVar1 = uVar8 + 1, lVar10 = uVar8 + 2, uVar8 = uVar1,
        local_88.fourcc[lVar4] == drwavGUID_W64_FMT[lVar10]) {
    if (uVar8 == 0xe) goto LAB_00122fcc;
  }
  if (uVar1 < 0xf) {
    return 0;
  }
LAB_00122fcc:
  sVar9 = (*onRead)(pUserData,&local_68,0x10);
  pdVar5 = local_50;
  if (sVar9 == 0x10) {
    *pRunningBytesReadOut = *pRunningBytesReadOut + 0x10;
    local_50->formatTag = local_68;
    local_50->channels = local_66;
    local_50->sampleRate = local_64;
    local_50->avgBytesPerSec = local_60;
    local_50->blockAlign = local_5c;
    local_50->bitsPerSample = local_5a;
    local_50->extendedSize = 0;
    local_50->validBitsPerSample = 0;
    local_50->channelMask = 0;
    local_50->subFormat[0] = '\0';
    local_50->subFormat[1] = '\0';
    local_50->subFormat[2] = '\0';
    local_50->subFormat[3] = '\0';
    local_50->subFormat[4] = '\0';
    local_50->subFormat[5] = '\0';
    local_50->subFormat[6] = '\0';
    local_50->subFormat[7] = '\0';
    local_50->subFormat[8] = '\0';
    local_50->subFormat[9] = '\0';
    local_50->subFormat[10] = '\0';
    local_50->subFormat[0xb] = '\0';
    local_50->subFormat[0xc] = '\0';
    local_50->subFormat[0xd] = '\0';
    local_50->subFormat[0xe] = '\0';
    local_50->subFormat[0xf] = '\0';
    if (CONCAT44(uStack_74,local_78) < 0x11) {
LAB_0012310a:
      if (local_70 != 0) {
        dVar7 = (*onSeek)(pUserData,local_70,drwav_seek_origin_current);
        if (dVar7 == 0) {
          return 0;
        }
        *pRunningBytesReadOut = *pRunningBytesReadOut + (ulong)local_70;
      }
      return 1;
    }
    sVar9 = (*onRead)(pUserData,&local_8a,2);
    if (sVar9 == 2) {
      *pRunningBytesReadOut = *pRunningBytesReadOut + 2;
      pdVar2 = &pdVar5->extendedSize;
      *pdVar2 = local_8a;
      if ((ulong)local_8a == 0) {
        lVar10 = 0x12;
      }
      else {
        if (local_8a != 0x16 && pdVar5->formatTag == 0xfffe) {
          return 0;
        }
        if (pdVar5->formatTag == 0xfffe) {
          sVar9 = (*onRead)(pUserData,&local_48,(ulong)local_8a);
          if (sVar9 != *pdVar2) {
            return 0;
          }
          pdVar5->validBitsPerSample = local_48;
          pdVar5->channelMask = local_46;
          *(undefined8 *)pdVar5->subFormat = local_42;
          *(undefined8 *)(pdVar5->subFormat + 8) = uStack_3a;
        }
        else {
          dVar7 = (*onSeek)(pUserData,(uint)local_8a,drwav_seek_origin_current);
          if (dVar7 == 0) {
            return 0;
          }
        }
        uVar3 = *pdVar2;
        *pRunningBytesReadOut = *pRunningBytesReadOut + (ulong)uVar3;
        lVar10 = (ulong)uVar3 + 0x12;
      }
      dVar7 = (*onSeek)(pUserData,local_78 - (int)lVar10,drwav_seek_origin_current);
      if (dVar7 != 0) {
        *pRunningBytesReadOut = *pRunningBytesReadOut + (CONCAT44(uStack_74,local_78) - lVar10);
        goto LAB_0012310a;
      }
    }
  }
  return 0;
}

Assistant:

static drwav_bool32 drwav__read_fmt(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_fmt* fmtOut)
{
    drwav_chunk_header header;
    drwav_uint8 fmt[16];

    if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
        return DRWAV_FALSE;
    }


    /* Skip non-fmt chunks. */
    while (((container == drwav_container_riff || container == drwav_container_rf64) && !drwav__fourcc_equal(header.id.fourcc, "fmt ")) || (container == drwav_container_w64 && !drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT))) {
        if (!drwav__seek_forward(onSeek, header.sizeInBytes + header.paddingSize, pUserData)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.sizeInBytes + header.paddingSize;

        /* Try the next header. */
        if (drwav__read_chunk_header(onRead, pUserData, container, pRunningBytesReadOut, &header) != DRWAV_SUCCESS) {
            return DRWAV_FALSE;
        }
    }


    /* Validation. */
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        if (!drwav__fourcc_equal(header.id.fourcc, "fmt ")) {
            return DRWAV_FALSE;
        }
    } else {
        if (!drwav__guid_equal(header.id.guid, drwavGUID_W64_FMT)) {
            return DRWAV_FALSE;
        }
    }


    if (onRead(pUserData, fmt, sizeof(fmt)) != sizeof(fmt)) {
        return DRWAV_FALSE;
    }
    *pRunningBytesReadOut += sizeof(fmt);

    fmtOut->formatTag      = drwav__bytes_to_u16(fmt + 0);
    fmtOut->channels       = drwav__bytes_to_u16(fmt + 2);
    fmtOut->sampleRate     = drwav__bytes_to_u32(fmt + 4);
    fmtOut->avgBytesPerSec = drwav__bytes_to_u32(fmt + 8);
    fmtOut->blockAlign     = drwav__bytes_to_u16(fmt + 12);
    fmtOut->bitsPerSample  = drwav__bytes_to_u16(fmt + 14);

    fmtOut->extendedSize       = 0;
    fmtOut->validBitsPerSample = 0;
    fmtOut->channelMask        = 0;
    memset(fmtOut->subFormat, 0, sizeof(fmtOut->subFormat));

    if (header.sizeInBytes > 16) {
        drwav_uint8 fmt_cbSize[2];
        int bytesReadSoFar = 0;

        if (onRead(pUserData, fmt_cbSize, sizeof(fmt_cbSize)) != sizeof(fmt_cbSize)) {
            return DRWAV_FALSE;    /* Expecting more data. */
        }
        *pRunningBytesReadOut += sizeof(fmt_cbSize);

        bytesReadSoFar = 18;

        fmtOut->extendedSize = drwav__bytes_to_u16(fmt_cbSize);
        if (fmtOut->extendedSize > 0) {
            /* Simple validation. */
            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                if (fmtOut->extendedSize != 22) {
                    return DRWAV_FALSE;
                }
            }

            if (fmtOut->formatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
                drwav_uint8 fmtext[22];
                if (onRead(pUserData, fmtext, fmtOut->extendedSize) != fmtOut->extendedSize) {
                    return DRWAV_FALSE;    /* Expecting more data. */
                }

                fmtOut->validBitsPerSample = drwav__bytes_to_u16(fmtext + 0);
                fmtOut->channelMask        = drwav__bytes_to_u32(fmtext + 2);
                drwav__bytes_to_guid(fmtext + 6, fmtOut->subFormat);
            } else {
                if (!onSeek(pUserData, fmtOut->extendedSize, drwav_seek_origin_current)) {
                    return DRWAV_FALSE;
                }
            }
            *pRunningBytesReadOut += fmtOut->extendedSize;

            bytesReadSoFar += fmtOut->extendedSize;
        }

        /* Seek past any leftover bytes. For w64 the leftover will be defined based on the chunk size. */
        if (!onSeek(pUserData, (int)(header.sizeInBytes - bytesReadSoFar), drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += (header.sizeInBytes - bytesReadSoFar);
    }

    if (header.paddingSize > 0) {
        if (!onSeek(pUserData, header.paddingSize, drwav_seek_origin_current)) {
            return DRWAV_FALSE;
        }
        *pRunningBytesReadOut += header.paddingSize;
    }

    return DRWAV_TRUE;
}